

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDSectorType::MinimumSectorFaceCount(ON_SubDVertexTag vertex_tag)

{
  uint local_10;
  uint minimum_sector_face_count;
  ON_SubDVertexTag vertex_tag_local;
  
  switch(vertex_tag) {
  case Unset:
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x1ed,"","Unset tag.");
    local_10 = 0xffffffff;
    break;
  case Smooth:
    local_10 = 2;
    break;
  case Crease:
    local_10 = 1;
    break;
  case Corner:
    local_10 = 1;
    break;
  case Dart:
    local_10 = 2;
    break;
  default:
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x20a,"","Invalid tag.");
    local_10 = 0xffffffff;
  }
  return local_10;
}

Assistant:

unsigned int ON_SubDSectorType::MinimumSectorFaceCount(
  ON_SubDVertexTag vertex_tag
  )
{
  unsigned int minimum_sector_face_count;
  switch (vertex_tag)
  {
  case ON_SubDVertexTag::Unset:
    ON_SUBD_ERROR("Unset tag.");
    minimum_sector_face_count = ON_UNSET_UINT_INDEX;
    break;

  case ON_SubDVertexTag::Smooth:
    // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
    // See comments in ON_SubDSectorType::GetSurfaceEvaluationCoefficients()
    // for more details on how this case is handled.
    minimum_sector_face_count = 2; // 3 without special case handling
    break;

  case ON_SubDVertexTag::Crease:
    // A "wire" crease can have zero faces - this is the minimum when faces exist
    minimum_sector_face_count = 1;
    break;

  case ON_SubDVertexTag::Corner:
    // A "wire" corner can have zero faces - this is the minimum when faces exist
    minimum_sector_face_count = 1;
    break;

  case ON_SubDVertexTag::Dart:
    // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
    // See comments in ON_SubDSectorType::GetSurfaceEvaluationCoefficients()
    // for more details on how this case is handled.
    minimum_sector_face_count = 2; // 3 without special case handling
    break;

  default:
    ON_SUBD_ERROR("Invalid tag.");
    minimum_sector_face_count = ON_UNSET_UINT_INDEX;
    break;
  }

  return minimum_sector_face_count;
}